

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

AstNode * parse_suffixed_expression(ParserState *parser)

{
  _Bool *p_Var1;
  int line;
  int iVar2;
  LexerState *ls_00;
  LexerState *ls_01;
  AstNode *pAVar3;
  AstNode *pAVar4;
  AstNode *node;
  StringObject *pSVar5;
  AstNodeList **ppAVar6;
  LexerState *ls;
  
  ls_00 = parser->ls;
  if ((ls_00->t).token == 0x111) {
    pAVar3 = allocate_expr_ast_node(parser,EXPR_BUILTIN);
    (pAVar3->field_2).common_expr.type.type_code = RAVI_TUSERDATA;
    (pAVar3->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar3->field_2).unary_expr.unary_op = 0x111;
    (pAVar3->field_2).function_stmt.function_expr = (AstNode *)0x0;
    raviX_next(ls_00);
    checknext(ls_00,0x28);
    pAVar4 = parse_expression(parser);
    if ((pAVar4->type != EXPR_LITERAL) &&
       ((pAVar4->field_2).common_expr.type.type_code != RAVI_TSTRING)) {
      raviX_syntaxerror(ls_00,"Expected a size expression as second argument to C__new");
    }
    ppAVar6 = &(pAVar3->field_2).table_expr.expr_list;
    checknext(ls_00,0x2c);
    node = parse_expression(parser);
    if (node == (AstNode *)0x0) {
      raviX_syntaxerror(ls_00,"Expected a size expression as second argument to C__new");
    }
    checknext(ls_00,0x29);
    add_ast_node(parser->compiler_state,ppAVar6,pAVar4);
    add_ast_node(parser->compiler_state,ppAVar6,node);
    return pAVar3;
  }
  line = ls_00->linenumber;
  pAVar3 = allocate_expr_ast_node(parser,EXPR_SUFFIXED);
  ls_01 = parser->ls;
  iVar2 = (ls_01->t).token;
  if (iVar2 == 0x12f) {
    pSVar5 = check_name_and_next(ls_01);
    pAVar4 = new_symbol_reference(parser,pSVar5);
    if (pAVar4 == (AstNode *)0x0) goto LAB_001102ab;
  }
  else {
    if (iVar2 != 0x28) {
      raviX_syntaxerror(ls_01,"unexpected symbol");
LAB_001102ab:
      __assert_fail("primary_expr",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/parser.c"
                    ,0x36f,"AstNode *parse_primary_expression(ParserState *)");
    }
    iVar2 = ls_01->linenumber;
    raviX_next(ls_01);
    pAVar4 = parse_expression(parser);
    p_Var1 = &(pAVar4->field_2).embedded_C_stmt.is_decl;
    *p_Var1 = (_Bool)(*p_Var1 | 1);
    check_match(ls_01,0x29,0x28,iVar2);
  }
  (pAVar3->field_2).function_stmt.function_expr = pAVar4;
  ppAVar6 = &(pAVar3->field_2).for_stmt.for_statement_list;
  pSVar5 = (pAVar4->field_2).goto_stmt.name;
  (pAVar3->field_2).return_stmt.expr_list = (pAVar4->field_2).return_stmt.expr_list;
  (pAVar3->field_2).goto_stmt.name = pSVar5;
  (pAVar3->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  do {
    while ((iVar2 = (ls_00->t).token, iVar2 == 0x28 || (iVar2 == 0x130))) {
LAB_00110241:
      pSVar5 = (StringObject *)0x0;
LAB_0011025e:
      pAVar4 = parse_function_call(parser,pSVar5,line);
      add_ast_node(parser->compiler_state,ppAVar6,pAVar4);
    }
    if (iVar2 == 0x3a) {
      raviX_next(ls_00);
      pSVar5 = check_name_and_next(ls_00);
      goto LAB_0011025e;
    }
    if (iVar2 == 0x5b) {
      pAVar4 = parse_yindex(parser);
    }
    else {
      if (iVar2 == 0x7b) goto LAB_00110241;
      if (iVar2 != 0x2e) {
        return pAVar3;
      }
      pAVar4 = parse_field_selector(parser);
    }
    add_ast_node(parser->compiler_state,ppAVar6,pAVar4);
    (pAVar3->field_2).common_expr.type.type_code = RAVI_TANY;
    (pAVar3->field_2).goto_stmt.name = (StringObject *)0x0;
  } while( true );
}

Assistant:

static AstNode *parse_suffixed_expression(ParserState *parser)
{
	LexerState *ls = parser->ls;
	/* suffixedexp ->
	primaryexp { '.' NAME | '[' exp ']' | ':' NAME funcargs | funcargs } */
	int line = ls->linenumber;
	if (ls->t.token == TOK_C__new) {
		return parse_builtin_expression(parser, TOK_C__new);
	}
	AstNode *suffixed_expr = allocate_expr_ast_node(parser, EXPR_SUFFIXED);
	suffixed_expr->suffixed_expr.primary_expr = parse_primary_expression(parser);
	suffixed_expr->suffixed_expr.type = suffixed_expr->suffixed_expr.primary_expr->common_expr.type;
	suffixed_expr->suffixed_expr.suffix_list = NULL;
	for (;;) {
		switch (ls->t.token) {
		case '.': { /* fieldsel */
			AstNode *suffix = parse_field_selector(parser);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			set_type(&suffixed_expr->suffixed_expr.type, RAVI_TANY);
			break;
		}
		case '[': { /* '[' exp1 ']' */
			AstNode *suffix = parse_yindex(parser);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			set_type(&suffixed_expr->suffixed_expr.type, RAVI_TANY);
			break;
		}
		case ':': { /* ':' NAME funcargs */
			raviX_next(ls);
			const StringObject *methodname = check_name_and_next(ls);
			AstNode *suffix = parse_function_call(parser, methodname, line);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			break;
		}
		case '(':
		case TOK_STRING:
		case '{': { /* funcargs */
			AstNode *suffix = parse_function_call(parser, NULL, line);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			break;
		}
		default:
			return suffixed_expr;
		}
	}
}